

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<basisu::vector<unsigned_char>_>::~vector
          (vector<basisu::vector<unsigned_char>_> *this)

{
  uint uVar1;
  void *__ptr;
  vector<unsigned_char> *__ptr_00;
  long lVar2;
  
  __ptr_00 = this->m_p;
  if (__ptr_00 != (vector<unsigned_char> *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar2 = 0;
      do {
        __ptr = *(void **)((long)&__ptr_00->m_p + lVar2);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar2 = lVar2 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar2);
      __ptr_00 = this->m_p;
    }
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }